

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest1_2 *this,_variable_type *variable_type,
          uint array_size)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  char *local_770;
  char *local_740;
  string local_668 [36];
  uint local_644;
  string local_640 [4];
  uint array_index_3;
  undefined1 local_620 [8];
  string variable_type_glsl_as_int_1;
  uint local_5f8;
  _variable_type result_as_int_variable_type_1;
  uint n_component;
  uint array_index_2;
  string variable_type_glsl_as_int;
  uint local_5c8;
  _variable_type result_as_int_variable_type;
  uint array_index_1;
  uint array_index;
  string local_5a0 [32];
  string local_580 [36];
  int local_55c;
  string local_558 [4];
  int n_getter;
  string local_538 [32];
  string local_518 [32];
  stringstream local_4f8 [8];
  stringstream variable_type_glsl_arrayed_sstream;
  ostream local_4e8;
  stringstream local_370 [8];
  stringstream variable_type_glsl_array_sstream;
  ostream local_360;
  undefined1 local_1d8 [8];
  string variable_type_glsl;
  stringstream result_sstream;
  ostream local_1a8;
  uint local_2c;
  _variable_type local_28;
  uint n_variable_type_components;
  _variable_type base_variable_type;
  uint array_size_local;
  _variable_type *variable_type_local;
  FunctionalTest1_2 *this_local;
  
  n_variable_type_components = array_size;
  _base_variable_type = (Utils *)variable_type;
  variable_type_local = (_variable_type *)this;
  this_local = (FunctionalTest1_2 *)__return_storage_ptr__;
  local_28 = Utils::getBaseVariableType(variable_type);
  local_2c = Utils::getNumberOfComponentsForVariableType((_variable_type *)_base_variable_type);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(variable_type_glsl.field_2._M_local_buf + 8));
  Utils::getVariableTypeGLSLString_abi_cxx11_
            ((string *)local_1d8,_base_variable_type,
             (_variable_type *)CONCAT71(extraout_var,extraout_DL));
  std::__cxx11::stringstream::stringstream(local_370);
  std::__cxx11::stringstream::stringstream(local_4f8);
  std::operator<<(&local_4e8,(string *)local_1d8);
  if (1 < n_variable_type_components) {
    poVar2 = std::operator<<(&local_360,"[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n_variable_type_components);
    std::operator<<(poVar2,"]");
    std::__cxx11::stringstream::str();
    std::operator<<(&local_4e8,local_518);
    std::__cxx11::string::~string(local_518);
  }
  std::operator<<(&local_1a8,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n");
  if (*(int *)_base_variable_type == 4) {
    std::operator<<(&local_1a8,"#extension GL_ARB_gpu_shader_fp64 : require\n");
  }
  poVar2 = std::operator<<(&local_1a8,"\nsubroutine ");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<(poVar2,local_538);
  poVar2 = std::operator<<(poVar2," colorGetter(in ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d8);
  poVar2 = std::operator<<(poVar2," in_value");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<(poVar2,local_558);
  std::operator<<(poVar2,");\n\n");
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_538);
  for (local_55c = 0; local_55c < 2; local_55c = local_55c + 1) {
    poVar2 = std::operator<<(&local_1a8,"subroutine(colorGetter) ");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_580);
    poVar2 = std::operator<<(poVar2," getter");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_55c);
    poVar2 = std::operator<<(poVar2,"(in ");
    poVar2 = std::operator<<(poVar2,(string *)local_1d8);
    poVar2 = std::operator<<(poVar2," in_value");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_5a0);
    std::operator<<(poVar2,")\n{\n");
    std::__cxx11::string::~string(local_5a0);
    std::__cxx11::string::~string(local_580);
    if (1 < n_variable_type_components) {
      poVar2 = std::operator<<(&local_1a8,(string *)local_1d8);
      poVar2 = std::operator<<(poVar2," temp");
      std::__cxx11::stringstream::str();
      poVar2 = std::operator<<(poVar2,(string *)&array_index_1);
      std::operator<<(poVar2,";\n");
      std::__cxx11::string::~string((string *)&array_index_1);
    }
    if (local_28 == VARIABLE_TYPE_BOOL) {
      if (n_variable_type_components < 2) {
        poVar2 = std::operator<<(&local_1a8,"    return ");
        if (local_55c == 0) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1d8,"bool");
          local_770 = "not";
          if (bVar1) {
            local_770 = "!";
          }
        }
        else {
          local_770 = "";
        }
        poVar2 = std::operator<<(poVar2,local_770);
        std::operator<<(poVar2,"(in_value);\n");
      }
      else {
        for (result_as_int_variable_type = VARIABLE_TYPE_BOOL;
            result_as_int_variable_type < n_variable_type_components;
            result_as_int_variable_type = result_as_int_variable_type + VARIABLE_TYPE_BVEC2) {
          poVar2 = std::operator<<(&local_1a8,"    temp[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,result_as_int_variable_type);
          poVar2 = std::operator<<(poVar2,"] = ");
          if (local_55c == 0) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1d8,"bool");
            local_740 = "not";
            if (bVar1) {
              local_740 = "!";
            }
          }
          else {
            local_740 = "";
          }
          poVar2 = std::operator<<(poVar2,local_740);
          poVar2 = std::operator<<(poVar2,"(in_value[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,result_as_int_variable_type);
          std::operator<<(poVar2,"]);\n");
        }
        std::operator<<(&local_1a8,"    return temp;\n");
      }
    }
    else if (n_variable_type_components < 2) {
      poVar2 = std::operator<<(&local_1a8,"    return (in_value + ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_55c + 1);
      std::operator<<(poVar2,");\n");
    }
    else {
      for (local_5c8 = 0; local_5c8 < n_variable_type_components; local_5c8 = local_5c8 + 1) {
        poVar2 = std::operator<<(&local_1a8,"    temp[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c8);
        poVar2 = std::operator<<(poVar2,"] = in_value[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c8);
        poVar2 = std::operator<<(poVar2,"] + ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_55c + 1);
        std::operator<<(poVar2,";\n");
      }
      std::operator<<(&local_1a8,"    return temp;\n");
    }
    std::operator<<(&local_1a8,"}\n");
  }
  std::operator<<(&local_1a8,"subroutine uniform colorGetter colorGetterUniform;\n\n");
  std::operator<<(&local_1a8,"out ");
  if (local_28 == VARIABLE_TYPE_BOOL) {
    variable_type_glsl_as_int.field_2._8_4_ = 9;
    variable_type_glsl_as_int.field_2._12_4_ =
         Utils::getVariableTypeFromProperties
                   ((_variable_type *)(variable_type_glsl_as_int.field_2._M_local_buf + 8),&local_2c
                   );
    Utils::getVariableTypeGLSLString_abi_cxx11_
              ((string *)&n_component,
               (Utils *)(variable_type_glsl_as_int.field_2._M_local_buf + 0xc),
               (_variable_type *)CONCAT71(extraout_var_00,extraout_DL_00));
    std::operator<<(&local_1a8,(string *)&n_component);
    std::__cxx11::string::~string((string *)&n_component);
  }
  else {
    std::operator<<(&local_1a8,(string *)local_1d8);
  }
  std::operator<<(&local_1a8," result;\n\n");
  poVar2 = std::operator<<(&local_1a8,"void main()\n{\n    ");
  poVar2 = std::operator<<(poVar2,(string *)local_1d8);
  std::operator<<(poVar2," temp");
  if (1 < n_variable_type_components) {
    poVar2 = std::operator<<(&local_1a8,"[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n_variable_type_components);
    std::operator<<(poVar2,"]");
  }
  std::operator<<(&local_1a8,";\n");
  for (result_as_int_variable_type_1 = VARIABLE_TYPE_BOOL;
      result_as_int_variable_type_1 < n_variable_type_components;
      result_as_int_variable_type_1 = result_as_int_variable_type_1 + VARIABLE_TYPE_BVEC2) {
    std::operator<<(&local_1a8,"    temp");
    if (1 < n_variable_type_components) {
      poVar2 = std::operator<<(&local_1a8,"[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,result_as_int_variable_type_1);
      std::operator<<(poVar2,"]");
    }
    poVar2 = std::operator<<(&local_1a8," = ");
    poVar2 = std::operator<<(poVar2,(string *)local_1d8);
    std::operator<<(poVar2,"(");
    if (local_28 == VARIABLE_TYPE_BOOL) {
      std::operator<<(&local_1a8,"true");
    }
    else {
      for (local_5f8 = 0; local_5f8 < local_2c; local_5f8 = local_5f8 + 1) {
        std::operator<<(&local_1a8,"3");
        if (local_5f8 != local_2c - 1) {
          std::operator<<(&local_1a8,", ");
        }
      }
    }
    std::operator<<(&local_1a8,");\n");
  }
  if (local_28 == VARIABLE_TYPE_BOOL) {
    variable_type_glsl_as_int_1.field_2._8_4_ = 9;
    variable_type_glsl_as_int_1.field_2._12_4_ =
         Utils::getVariableTypeFromProperties
                   ((_variable_type *)(variable_type_glsl_as_int_1.field_2._M_local_buf + 8),
                    &local_2c);
    Utils::getVariableTypeGLSLString_abi_cxx11_
              ((string *)local_620,(Utils *)(variable_type_glsl_as_int_1.field_2._M_local_buf + 0xc)
               ,(_variable_type *)CONCAT71(extraout_var_01,extraout_DL_01));
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(&local_1a8,local_640);
    std::operator<<(poVar2," subroutine_result = colorGetterUniform(temp);\nresult = ");
    std::__cxx11::string::~string(local_640);
    for (local_644 = 0; local_644 < n_variable_type_components; local_644 = local_644 + 1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1d8,"bool");
      if (bVar1) {
        std::operator<<(&local_1a8,"bool(subroutine_result");
      }
      else {
        std::operator<<(&local_1a8,"all(subroutine_result");
      }
      if (1 < n_variable_type_components) {
        poVar2 = std::operator<<(&local_1a8,"[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_644);
        std::operator<<(poVar2,"]");
      }
      std::operator<<(&local_1a8,")");
      if (local_644 != n_variable_type_components - 1) {
        std::operator<<(&local_1a8,"&& ");
      }
    }
    poVar2 = std::operator<<(&local_1a8," == true ? ");
    poVar2 = std::operator<<(poVar2,(string *)local_620);
    poVar2 = std::operator<<(poVar2,"(1) : ");
    poVar2 = std::operator<<(poVar2,(string *)local_620);
    std::operator<<(poVar2,"(0);");
    std::__cxx11::string::~string((string *)local_620);
  }
  else if (n_variable_type_components < 2) {
    std::operator<<(&local_1a8,"result = colorGetterUniform(temp);\n");
  }
  else {
    poVar2 = std::operator<<(&local_1a8,(string *)local_1d8);
    poVar2 = std::operator<<(poVar2," subroutine_result");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_668);
    poVar2 = std::operator<<(poVar2,
                             " = colorGetterUniform(temp);\n\nif (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\nelse\nresult = "
                            );
    poVar2 = std::operator<<(poVar2,(string *)local_1d8);
    std::operator<<(poVar2,"(-1);\n");
    std::__cxx11::string::~string(local_668);
  }
  std::operator<<(&local_1a8,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_4f8);
  std::__cxx11::stringstream::~stringstream(local_370);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(variable_type_glsl.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest1_2::getVertexShaderBody(const Utils::_variable_type& variable_type, unsigned int array_size)
{
	Utils::_variable_type base_variable_type		 = Utils::getBaseVariableType(variable_type);
	unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	std::stringstream	 result_sstream;
	std::string			  variable_type_glsl = Utils::getVariableTypeGLSLString(variable_type);
	std::stringstream	 variable_type_glsl_array_sstream;
	std::stringstream	 variable_type_glsl_arrayed_sstream;

	variable_type_glsl_arrayed_sstream << variable_type_glsl;

	if (array_size > 1)
	{
		variable_type_glsl_array_sstream << "[" << array_size << "]";
		variable_type_glsl_arrayed_sstream << variable_type_glsl_array_sstream.str();
	}

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n";

	if (variable_type == Utils::VARIABLE_TYPE_DOUBLE)
	{
		result_sstream << "#extension GL_ARB_gpu_shader_fp64 : require\n";
	}

	/* Form subroutine type declaration */
	result_sstream << "\n"
					  "subroutine "
				   << variable_type_glsl_arrayed_sstream.str() << " colorGetter(in " << variable_type_glsl
				   << " in_value" << variable_type_glsl_array_sstream.str() << ");\n"
																			   "\n";

	/* Declare getter functions */
	for (int n_getter = 0; n_getter < 2; ++n_getter)
	{
		result_sstream << "subroutine(colorGetter) " << variable_type_glsl_arrayed_sstream.str() << " getter"
					   << n_getter << "(in " << variable_type_glsl << " in_value"
					   << variable_type_glsl_array_sstream.str() << ")\n"
																	"{\n";

		if (array_size > 1)
		{
			result_sstream << variable_type_glsl << " temp" << variable_type_glsl_array_sstream.str() << ";\n";
		}

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = "
								   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
								   << "(in_value[" << array_index << "]);\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return "
							   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
							   << "(in_value);\n";
			}
		} /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
		else
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = in_value["
								   << array_index << "] + " << (n_getter + 1) << ";\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return (in_value + " << (n_getter + 1) << ");\n";
			}
		}

		result_sstream << "}\n";
	} /* for (both getter functions) */

	/* Declare subroutine uniform */
	result_sstream << "subroutine uniform colorGetter colorGetterUniform;\n"
					  "\n";

	/* Declare output variable */
	result_sstream << "out ";

	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_as_int;
	}
	else
	{
		result_sstream << variable_type_glsl;
	}

	result_sstream << " result;\n"
					  "\n";

	/* Declare main(): prepare input argument for the subroutine function */
	result_sstream << "void main()\n"
					  "{\n"
					  "    "
				   << variable_type_glsl << " temp";

	if (array_size > 1)
	{
		result_sstream << "[" << array_size << "]";
	};

	result_sstream << ";\n";

	for (unsigned int array_index = 0; array_index < array_size; ++array_index)
	{
		result_sstream << "    temp";

		if (array_size > 1)
		{
			result_sstream << "[" << array_index << "]";
		}

		result_sstream << " = " << variable_type_glsl << "(";

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			result_sstream << "true";
		}
		else
		{
			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << "3";

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			} /* for (all components) */
		}

		result_sstream << ");\n";
	} /* for (all array indices) */

	/* Declare main(): call the subroutine. Verify the input and write the result
	 *                 to the output variable.
	 **/
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_arrayed_sstream.str() << " subroutine_result = colorGetterUniform(temp);\n"
																	  "result = ";

		for (unsigned int array_index = 0; array_index < array_size; ++array_index)
		{
			if (variable_type_glsl == "bool")
				result_sstream << "bool(subroutine_result";
			else
				result_sstream << "all(subroutine_result";

			if (array_size > 1)
			{
				result_sstream << "[" << array_index << "]";
			}

			result_sstream << ")";

			if (array_index != (array_size - 1))
			{
				result_sstream << "&& ";
			}
		}

		result_sstream << " == true ? " << variable_type_glsl_as_int << "(1) : " << variable_type_glsl_as_int << "(0);";
	}
	else
	{
		if (array_size > 1)
		{
			DE_ASSERT(array_size == 2);

			result_sstream << variable_type_glsl << " subroutine_result" << variable_type_glsl_array_sstream.str()
						   << " = colorGetterUniform(temp);\n"
							  "\n"
							  "if (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\n"
							  "else\n"
							  "result = "
						   << variable_type_glsl << "(-1);\n";
		}
		else
		{
			result_sstream << "result = colorGetterUniform(temp);\n";
		}
	}

	/* All done */
	result_sstream << "}\n";

	return result_sstream.str();
}